

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

Vec_Int_t * Acb_ObjMarkTfo(Acb_Ntk_t *p,Vec_Int_t *vDivs,int Pivot,int nTfoLevMax,int nFanMax)

{
  int iVar1;
  Vec_Int_t *p_00;
  undefined4 local_34;
  int iObj;
  int i;
  Vec_Int_t *vMarked;
  int nFanMax_local;
  int nTfoLevMax_local;
  int Pivot_local;
  Vec_Int_t *vDivs_local;
  Acb_Ntk_t *p_local;
  
  p_00 = Vec_IntAlloc(1000);
  Acb_NtkIncTravId(p);
  Acb_ObjSetTravIdCur(p,Pivot);
  Vec_IntPush(p_00,Pivot);
  for (local_34 = 0; iVar1 = Vec_IntSize(vDivs), local_34 < iVar1; local_34 = local_34 + 1) {
    iVar1 = Vec_IntEntry(vDivs,local_34);
    Acb_ObjMarkTfo_rec(p,iVar1,nTfoLevMax,nFanMax,p_00);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Acb_ObjMarkTfo( Acb_Ntk_t * p, Vec_Int_t * vDivs, int Pivot, int nTfoLevMax, int nFanMax )
{
    Vec_Int_t * vMarked = Vec_IntAlloc( 1000 );
    int i, iObj;
    Acb_NtkIncTravId( p );
    Acb_ObjSetTravIdCur( p, Pivot );
    Vec_IntPush( vMarked, Pivot );
    Vec_IntForEachEntry( vDivs, iObj, i )
        Acb_ObjMarkTfo_rec( p, iObj, nTfoLevMax, nFanMax, vMarked );
    return vMarked;
}